

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

string * doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::
         getCurrentTimestamp_abi_cxx11_(void)

{
  string *in_RDI;
  allocator<char> local_81;
  char *local_80;
  char *fmt;
  char timeStamp [21];
  undefined1 local_58 [8];
  tm timeInfo;
  unsigned_long timeStampSize;
  time_t rawtime;
  
  time((time_t *)&timeStampSize);
  timeInfo.tm_zone = (char *)0x15;
  gmtime_r((time_t *)&timeStampSize,(tm *)local_58);
  local_80 = "%Y-%m-%dT%H:%M:%SZ";
  strftime((char *)&fmt,0x15,"%Y-%m-%dT%H:%M:%SZ",(tm *)local_58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,(char *)&fmt,&local_81);
  std::allocator<char>::~allocator(&local_81);
  return in_RDI;
}

Assistant:

static std::string getCurrentTimestamp() {
                // Beware, this is not reentrant because of backward compatibility issues
                // Also, UTC only, again because of backward compatibility (%z is C++11)
                time_t rawtime;
                std::time(&rawtime);
                auto const timeStampSize = sizeof("2017-01-16T17:06:45Z");

                std::tm timeInfo;
#ifdef DOCTEST_PLATFORM_WINDOWS
                gmtime_s(&timeInfo, &rawtime);
#else // DOCTEST_PLATFORM_WINDOWS
                gmtime_r(&rawtime, &timeInfo);
#endif // DOCTEST_PLATFORM_WINDOWS

                char timeStamp[timeStampSize];
                const char* const fmt = "%Y-%m-%dT%H:%M:%SZ";

                std::strftime(timeStamp, timeStampSize, fmt, &timeInfo);
                return std::string(timeStamp);
            }